

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

Rule * slang::ast::RandSeqProductionSymbol::createRule
                 (Rule *__return_storage_ptr__,RsRuleSyntax *syntax,ASTContext *context,
                 StatementBlockSymbol *ruleBlock)

{
  ParenthesizedExpressionSyntax *pPVar1;
  optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd> codeBlock_00;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  RsIfElseSyntax *pRVar5;
  Expression *this;
  RsRepeatSyntax *pRVar6;
  undefined4 extraout_var_00;
  RsProdItemSyntax *pRVar7;
  RsCaseSyntax *syntax_00;
  logic_error *this_00;
  ExpressionSyntax *pEVar8;
  undefined4 extraout_var_01;
  StatementBlockSymbol *pSVar9;
  undefined4 extraout_var_02;
  Type *pTVar10;
  Diagnostic *diag;
  undefined4 extraout_var_03;
  EVP_PKEY_CTX *src;
  span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_18446744073709551615UL> local_390;
  span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL> local_380
  ;
  bitmask<slang::ast::StatementFlags> local_36c;
  undefined1 local_368 [8];
  StatementContext stmtCtx;
  StatementBlockSymbol *block;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> __end2_1;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> __begin2_1;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
  *__range2_1;
  bitmask<slang::ast::ASTFlags> local_2f8;
  Expression *local_2f0;
  Expression *randJoinExpr;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> sStack_2e0;
  bool isRandJoin;
  CodeBlockProd local_2d8;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_2c8;
  bitmask<slang::ast::ASTFlags> local_2c0;
  RsWeightClauseSyntax *local_2b8;
  RsWeightClauseSyntax *wc;
  optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd> codeBlock;
  Expression *weightExpr;
  string local_288;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  CaseProd *local_1c0;
  RepeatProd *local_1b8;
  undefined1 local_1b0 [8];
  ProdItem item;
  Expression *expr_1;
  RsRepeatSyntax *rrs;
  ProdItem local_170;
  undefined1 local_150 [8];
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> elseItem;
  ProdItem ifItem;
  Expression *expr;
  RsIfElseSyntax *ries;
  CodeBlockProd *local_e8;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> local_e0 [3];
  ProdItem local_c8;
  ProdItem *local_a8;
  SyntaxNode *local_a0;
  RsProdSyntax *p;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RsProdSyntax> *__range2;
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> prods;
  Compilation *comp;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> blockIt;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
  blockRange;
  StatementBlockSymbol *ruleBlock_local;
  ASTContext *context_local;
  RsRuleSyntax *syntax_local;
  undefined4 extraout_var;
  
  _blockIt = Scope::membersOfType<slang::ast::StatementBlockSymbol>(&ruleBlock->super_Scope);
  comp = (Compilation *)
         iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
         ::begin((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                  *)&blockIt);
  prods.stackBase._24_8_ = ASTContext::getCompilation(context);
  SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> *)&__range2);
  __begin2 = (iterator)&syntax->prods;
  __end2 = nonstd::span_lite::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::begin
                     (&(syntax->prods).
                       super_span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>);
  p = (RsProdSyntax *)
      nonstd::span_lite::span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL>::end
                ((span<slang::syntax::RsProdSyntax_*,_18446744073709551615UL> *)(__begin2 + 4));
  do {
    uVar2 = prods.stackBase._24_8_;
    if ((RsProdSyntax *)__end2 == p) {
      codeBlock.super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>
      ._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
      _M_engaged = false;
      codeBlock.super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>
      ._M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
      _17_7_ = 0;
      std::optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd>::optional
                ((optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd> *)&wc);
      local_2b8 = syntax->weightClause;
      if (local_2b8 != (RsWeightClauseSyntax *)0x0) {
        pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&local_2b8->weight);
        bitmask<slang::ast::ASTFlags>::bitmask(&local_2c0,None);
        iVar4 = Expression::bind((int)pEVar8,(sockaddr *)context,(socklen_t)local_2c0.m_bits);
        codeBlock.
        super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
        _16_8_ = CONCAT44(extraout_var_01,iVar4);
        ASTContext::requireIntegral
                  (context,(Expression *)
                           codeBlock.
                           super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>
                           ._16_8_);
        if (local_2b8->codeBlock != (RsProdSyntax *)0x0) {
          local_2c8 = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                      ::end((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                             *)&blockIt);
          bVar3 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_std::forward_iterator_tag,_const_slang::ast::StatementBlockSymbol,_long,_const_slang::ast::StatementBlockSymbol_*,_const_slang::ast::StatementBlockSymbol_&>
                  ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_std::forward_iterator_tag,_const_slang::ast::StatementBlockSymbol,_long,_const_slang::ast::StatementBlockSymbol_*,_const_slang::ast::StatementBlockSymbol_&>
                                *)&comp,&local_2c8);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            assert::assertFailed
                      ("blockIt != blockRange.end()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                       ,0x5e8,
                       "static RandSeqProductionSymbol::Rule slang::ast::RandSeqProductionSymbol::createRule(const RsRuleSyntax &, const ASTContext &, const StatementBlockSymbol &)"
                      );
          }
          sStack_2e0 = Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator++
                                 ((specific_symbol_iterator<slang::ast::StatementBlockSymbol> *)
                                  &comp,0);
          pSVar9 = Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator*
                             (&stack0xfffffffffffffd20);
          CodeBlockProd::CodeBlockProd(&local_2d8,pSVar9);
          std::optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd>::operator=
                    ((optional<slang::ast::RandSeqProductionSymbol::CodeBlockProd> *)&wc,&local_2d8)
          ;
        }
      }
      randJoinExpr._7_1_ = 0;
      local_2f0 = (Expression *)0x0;
      if ((syntax->randJoin != (RandJoinClauseSyntax *)0x0) &&
         (randJoinExpr._7_1_ = 1, syntax->randJoin->expr != (ParenthesizedExpressionSyntax *)0x0)) {
        pPVar1 = syntax->randJoin->expr;
        bitmask<slang::ast::ASTFlags>::bitmask(&local_2f8,None);
        iVar4 = Expression::bind((int)pPVar1,(sockaddr *)context,(socklen_t)local_2f8.m_bits);
        local_2f0 = (Expression *)CONCAT44(extraout_var_02,iVar4);
        bVar3 = Expression::bad(local_2f0);
        if (!bVar3) {
          pTVar10 = not_null<const_slang::ast::Type_*>::operator->(&local_2f0->type);
          bVar3 = Type::isNumeric(pTVar10);
          if (!bVar3) {
            diag = ASTContext::addDiag(context,(DiagCode)0x890006,local_2f0->sourceRange);
            pTVar10 = not_null<const_slang::ast::Type_*>::operator*(&local_2f0->type);
            ast::operator<<(diag,pTVar10);
          }
        }
      }
      __end2_1 = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                 ::begin((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                          *)&blockIt);
      block = (StatementBlockSymbol *)
              iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
              ::end((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                     *)&blockIt);
      while (bVar3 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_std::forward_iterator_tag,_const_slang::ast::StatementBlockSymbol,_long,_const_slang::ast::StatementBlockSymbol_*,_const_slang::ast::StatementBlockSymbol_&>
                     ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_std::forward_iterator_tag,_const_slang::ast::StatementBlockSymbol,_long,_const_slang::ast::StatementBlockSymbol_*,_const_slang::ast::StatementBlockSymbol_&>
                                   *)&__end2_1,
                                  (specific_symbol_iterator<slang::ast::StatementBlockSymbol> *)
                                  &block), bVar3) {
        stmtCtx.rootAstContext =
             (ASTContext *)
             Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator*(&__end2_1)
        ;
        Statement::StatementContext::StatementContext((StatementContext *)local_368,context);
        bitmask<slang::ast::StatementFlags>::bitmask(&local_36c,InRandSeq);
        stmtCtx.blocks.size_._0_4_ = local_36c.m_bits;
        StatementBlockSymbol::getStatement
                  ((StatementBlockSymbol *)stmtCtx.rootAstContext,context,
                   (StatementContext *)local_368);
        Statement::StatementContext::~StatementContext((StatementContext *)local_368);
        Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator++(&__end2_1);
      }
      iVar4 = SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::copy
                        ((SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> *)
                         &__range2,(EVP_PKEY_CTX *)prods.stackBase._24_8_,src);
      local_390.data_ = (pointer)CONCAT44(extraout_var_03,iVar4);
      nonstd::span_lite::
      span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*const,_18446744073709551615UL>::
      span<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_18446744073709551615UL,_0>
                (&local_380,&local_390);
      codeBlock_00.
      super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
      _M_payload._M_value.block.ptr =
           (not_null<const_slang::ast::StatementBlockSymbol_*>)
           (not_null<const_slang::ast::StatementBlockSymbol_*>)
           codeBlock.
           super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
           _M_payload.
           super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
           _M_payload._0_8_;
      codeBlock_00.
      super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
      _M_payload._0_8_ = wc;
      codeBlock_00.
      super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
      _16_8_ = codeBlock.
               super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>.
               _M_payload.
               super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
               _M_payload._M_value.block.ptr;
      Rule::Rule(__return_storage_ptr__,ruleBlock,local_380,
                 (Expression *)
                 codeBlock.
                 super__Optional_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::CodeBlockProd>.
                 _16_8_,local_2f0,codeBlock_00,(bool)(randJoinExpr._7_1_ & 1));
      SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL>::~SmallVector
                ((SmallVector<const_slang::ast::RandSeqProductionSymbol::ProdBase_*,_5UL> *)
                 &__range2);
      return __return_storage_ptr__;
    }
    local_a0 = &(*__end2)->super_SyntaxNode;
    switch(local_a0->kind) {
    case RsCase:
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::RsCaseSyntax>(local_a0);
      local_1c0 = createCaseProd(syntax_00,context);
      SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::push_back
                ((SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> *)&__range2
                 ,(ProdBase **)&local_1c0);
      break;
    case RsCodeBlock:
      local_e0[0] = iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                    ::end((iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                           *)&blockIt);
      bVar3 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_std::forward_iterator_tag,_const_slang::ast::StatementBlockSymbol,_long,_const_slang::ast::StatementBlockSymbol_*,_const_slang::ast::StatementBlockSymbol_&>
              ::operator!=((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_std::forward_iterator_tag,_const_slang::ast::StatementBlockSymbol,_long,_const_slang::ast::StatementBlockSymbol_*,_const_slang::ast::StatementBlockSymbol_&>
                            *)&comp,local_e0);
      uVar2 = prods.stackBase._24_8_;
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        assert::assertFailed
                  ("blockIt != blockRange.end()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,0x5bd,
                   "static RandSeqProductionSymbol::Rule slang::ast::RandSeqProductionSymbol::createRule(const RsRuleSyntax &, const ASTContext &, const StatementBlockSymbol &)"
                  );
      }
      ries = (RsIfElseSyntax *)
             Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator++
                       ((specific_symbol_iterator<slang::ast::StatementBlockSymbol> *)&comp,0);
      pSVar9 = Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>::operator*
                         ((specific_symbol_iterator<slang::ast::StatementBlockSymbol> *)&ries);
      local_e8 = BumpAllocator::
                 emplace<slang::ast::RandSeqProductionSymbol::CodeBlockProd,slang::ast::StatementBlockSymbol_const&>
                           ((BumpAllocator *)uVar2,pSVar9);
      SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::push_back
                ((SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> *)&__range2
                 ,(ProdBase **)&local_e8);
      break;
    default:
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_260,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,&local_261);
      std::operator+(&local_240,&local_260,":");
      std::__cxx11::to_string(&local_288,0x5dd);
      std::operator+(&local_220,&local_240,&local_288);
      std::operator+(&local_200,&local_220,": ");
      std::operator+(&local_1e0,&local_200,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_1e0);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    case RsIfElse:
      pRVar5 = slang::syntax::SyntaxNode::as<slang::syntax::RsIfElseSyntax>(local_a0);
      pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pRVar5->condition);
      bitmask<slang::ast::ASTFlags>::bitmask
                ((bitmask<slang::ast::ASTFlags> *)&ifItem.args.size_,None);
      iVar4 = Expression::bind((int)pEVar8,(sockaddr *)context,(socklen_t)ifItem.args.size_);
      this = (Expression *)CONCAT44(extraout_var,iVar4);
      pRVar7 = not_null<slang::syntax::RsProdItemSyntax_*>::operator*(&pRVar5->ifItem);
      createProdItem((ProdItem *)
                     &elseItem.
                      super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
                      _M_engaged,pRVar7,context);
      std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::optional
                ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)local_150);
      if (pRVar5->elseClause != (RsElseClauseSyntax *)0x0) {
        pRVar7 = not_null<slang::syntax::RsProdItemSyntax_*>::operator*(&pRVar5->elseClause->item);
        createProdItem(&local_170,pRVar7,context);
        std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>::operator=
                  ((optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)local_150,&local_170);
      }
      bVar3 = Expression::bad(this);
      if (!bVar3) {
        ASTContext::requireBooleanConvertible(context,this);
      }
      rrs = (RsRepeatSyntax *)
            BumpAllocator::
            emplace<slang::ast::RandSeqProductionSymbol::IfElseProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                      ((BumpAllocator *)prods.stackBase._24_8_,this,
                       (ProdItem *)
                       &elseItem.
                        super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
                        _M_engaged,
                       (optional<slang::ast::RandSeqProductionSymbol::ProdItem> *)local_150);
      SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::push_back
                ((SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> *)&__range2
                 ,(ProdBase **)&rrs);
      break;
    case RsProdItem:
      pRVar7 = slang::syntax::SyntaxNode::as<slang::syntax::RsProdItemSyntax>(local_a0);
      createProdItem(&local_c8,pRVar7,context);
      local_a8 = BumpAllocator::
                 emplace<slang::ast::RandSeqProductionSymbol::ProdItem,slang::ast::RandSeqProductionSymbol::ProdItem>
                           ((BumpAllocator *)uVar2,&local_c8);
      SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::push_back
                ((SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> *)&__range2
                 ,(ProdBase **)&local_a8);
      break;
    case RsRepeat:
      pRVar6 = slang::syntax::SyntaxNode::as<slang::syntax::RsRepeatSyntax>(local_a0);
      pEVar8 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&pRVar6->expr);
      bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&item.args.size_,None)
      ;
      iVar4 = Expression::bind((int)pEVar8,(sockaddr *)context,(socklen_t)item.args.size_);
      pRVar7 = not_null<slang::syntax::RsProdItemSyntax_*>::operator*(&pRVar6->item);
      createProdItem((ProdItem *)local_1b0,pRVar7,context);
      local_1b8 = BumpAllocator::
                  emplace<slang::ast::RandSeqProductionSymbol::RepeatProd,slang::ast::Expression_const&,slang::ast::RandSeqProductionSymbol::ProdItem&>
                            ((BumpAllocator *)prods.stackBase._24_8_,
                             (Expression *)CONCAT44(extraout_var_00,iVar4),(ProdItem *)local_1b0);
      SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*>::push_back
                ((SmallVectorBase<const_slang::ast::RandSeqProductionSymbol::ProdBase_*> *)&__range2
                 ,(ProdBase **)&local_1b8);
      ASTContext::requireIntegral(context,(Expression *)CONCAT44(extraout_var_00,iVar4));
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

RandSeqProductionSymbol::Rule RandSeqProductionSymbol::createRule(
    const RsRuleSyntax& syntax, const ASTContext& context, const StatementBlockSymbol& ruleBlock) {

    auto blockRange = ruleBlock.membersOfType<StatementBlockSymbol>();
    auto blockIt = blockRange.begin();

    auto& comp = context.getCompilation();
    SmallVector<const ProdBase*> prods;
    for (auto p : syntax.prods) {
        switch (p->kind) {
            case SyntaxKind::RsProdItem:
                prods.push_back(
                    comp.emplace<ProdItem>(createProdItem(p->as<RsProdItemSyntax>(), context)));
                break;
            case SyntaxKind::RsCodeBlock: {
                ASSERT(blockIt != blockRange.end());
                prods.push_back(comp.emplace<CodeBlockProd>(*blockIt++));
                break;
            }
            case SyntaxKind::RsIfElse: {
                auto& ries = p->as<RsIfElseSyntax>();
                auto& expr = Expression::bind(*ries.condition, context);
                auto ifItem = createProdItem(*ries.ifItem, context);

                std::optional<ProdItem> elseItem;
                if (ries.elseClause)
                    elseItem = createProdItem(*ries.elseClause->item, context);

                if (!expr.bad())
                    context.requireBooleanConvertible(expr);

                prods.push_back(comp.emplace<IfElseProd>(expr, ifItem, elseItem));
                break;
            }
            case SyntaxKind::RsRepeat: {
                auto& rrs = p->as<RsRepeatSyntax>();
                auto& expr = Expression::bind(*rrs.expr, context);
                auto item = createProdItem(*rrs.item, context);
                prods.push_back(comp.emplace<RepeatProd>(expr, item));

                context.requireIntegral(expr);
                break;
            }
            case SyntaxKind::RsCase:
                prods.push_back(&createCaseProd(p->as<RsCaseSyntax>(), context));
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    const Expression* weightExpr = nullptr;
    std::optional<CodeBlockProd> codeBlock;
    if (auto wc = syntax.weightClause) {
        weightExpr = &Expression::bind(*wc->weight, context);
        context.requireIntegral(*weightExpr);

        if (wc->codeBlock) {
            ASSERT(blockIt != blockRange.end());
            codeBlock = CodeBlockProd(*blockIt++);
        }
    }

    bool isRandJoin = false;
    const Expression* randJoinExpr = nullptr;
    if (syntax.randJoin) {
        isRandJoin = true;
        if (syntax.randJoin->expr) {
            randJoinExpr = &Expression::bind(*syntax.randJoin->expr, context);

            if (!randJoinExpr->bad() && !randJoinExpr->type->isNumeric()) {
                context.addDiag(diag::RandJoinNotNumeric, randJoinExpr->sourceRange)
                    << *randJoinExpr->type;
            }
        }
    }

    for (auto& block : blockRange) {
        Statement::StatementContext stmtCtx(context);
        stmtCtx.flags = StatementFlags::InRandSeq;
        block.getStatement(context, stmtCtx);
    }

    return {ruleBlock, prods.copy(comp), weightExpr, randJoinExpr, codeBlock, isRandJoin};
}